

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed)

{
  ExtensionInfo info_00;
  LogMessage *pLVar1;
  undefined1 local_108 [8];
  ExtensionInfo info;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_17;
  byte local_16;
  FieldType local_15;
  int local_14;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *containing_type_local;
  
  local_51 = 0;
  local_17 = is_packed;
  local_16 = is_repeated;
  local_15 = type;
  local_14 = number;
  pMStack_10 = containing_type;
  if (type == '\x0e') {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x73);
    local_51 = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_50,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (local_15 == '\v') {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x74);
    local_a1 = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  info.descriptor._7_1_ = 0;
  if (local_15 == '\n') {
    LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x75);
    info.descriptor._7_1_ = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_e0,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 6),pLVar1);
  }
  if ((info.descriptor._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_e0);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_108,local_15,(bool)(local_16 & 1),(bool)(local_17 & 1));
  info_00.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)info._0_8_;
  info_00.type = local_108[0];
  info_00.is_repeated = (bool)local_108[1];
  info_00.is_packed = (bool)local_108[2];
  info_00._3_5_ = local_108._3_5_;
  info_00.field_3.enum_validity_check.arg = info.field_3.enum_validity_check.func;
  info_00.descriptor = (FieldDescriptor *)info.field_3.enum_validity_check.arg;
  anon_unknown_0::Register(pMStack_10,local_14,info_00);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* containing_type,
                                     int number, FieldType type,
                                     bool is_repeated, bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  Register(containing_type, number, info);
}